

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::inject_without_bind::test_method(inject_without_bind *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  no_binding *e;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]> local_100;
  assertion_result local_e0;
  basic_cstring<const_char> local_c8;
  basic_cstring<const_char> local_b8;
  undefined1 local_a8 [8];
  injected<Inject::service> x_1;
  undefined1 local_88 [8];
  context<0> c;
  component<Inject::service> x;
  inject_without_bind *this_local;
  
  inject::context<0>::component<Inject::service>::component
            ((component<Inject::service> *)&c._parent);
  inject::context<0>::context((context<0> *)local_88);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_a8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b8,0x85,&local_c8);
    boost::test_tools::assertion_result::assertion_result(&local_e0,false);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_100,prev,(char (*) [22])"no_binding not thrown");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&e,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::test_tools::tt_detail::report_assertion(&local_e0,&local_100,&e,0x85,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>::
    ~lazy_ostream_impl(&local_100);
    boost::test_tools::assertion_result::~assertion_result(&local_e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_a8);
  inject::context<0>::~context((context<0> *)local_88);
  inject::context<0>::component<Inject::service>::~component
            ((component<Inject::service> *)&c._parent);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(inject_without_bind)
{
    context<>::component<service> x;

    context<> c;
    try {
        context<>::injected<service> x;
        BOOST_ERROR("no_binding not thrown");
    } catch (const no_binding& e) {
        BOOST_CHECK_EQUAL(e.component(), id_of<service>::id());
    }
}